

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O1

string * TransportTypeAsString_abi_cxx11_
                   (string *__return_storage_ptr__,TransportProtocolType transport_type)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)CONCAT71(in_register_00000031,transport_type);
  if (iVar3 == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0022646d;
    pcVar4 = "v2";
    pcVar2 = "";
  }
  else if (iVar3 == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0022646d;
    pcVar4 = "v1";
    pcVar2 = "";
  }
  else {
    if (iVar3 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/connection_types.cpp"
                    ,0x27,"std::string TransportTypeAsString(TransportProtocolType)");
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0022646d:
      __stack_chk_fail();
    }
    pcVar4 = "detecting";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string TransportTypeAsString(TransportProtocolType transport_type)
{
    switch (transport_type) {
    case TransportProtocolType::DETECTING:
        return "detecting";
    case TransportProtocolType::V1:
        return "v1";
    case TransportProtocolType::V2:
        return "v2";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}